

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbify.cc
# Opt level: O3

base_learner * cbify_setup(options_i *options,vw *all)

{
  _func_int **pp_Var1;
  bool bVar2;
  undefined8 uVar3;
  byte bVar4;
  int iVar5;
  cbify *__s;
  _func_int ***ppp_Var6;
  option_group_definition *poVar7;
  typed_option<float> *ptVar8;
  base_learner *pbVar9;
  multi_learner *base;
  learner<cbify,_example> *plVar10;
  single_learner *base_00;
  long lVar11;
  undefined **ppuVar12;
  label_parser *plVar13;
  parser *ppVar14;
  cbify *data;
  byte bVar15;
  float fVar16;
  float fVar17;
  bool use_cs;
  uint32_t num_actions;
  size_type __dnew_4;
  option_group_definition new_options;
  size_type __dnew_1;
  size_type __dnew;
  size_type __dnew_2;
  size_type __dnew_3;
  bool local_519;
  vw *local_518;
  uint local_50c;
  cbify *local_508;
  float *local_500;
  _func_int ***local_4f8;
  _func_int **local_4f0;
  _func_int **local_4e8 [2];
  long local_4d8;
  _func_int ***local_4d0;
  _func_int **local_4c8;
  _func_int **local_4c0 [2];
  _func_int ***local_4b0;
  _func_int **local_4a8;
  _func_int **local_4a0 [2];
  _func_int ***local_490;
  _func_int **local_488;
  _func_int **local_480 [2];
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  option_group_definition local_3f0;
  undefined1 local_3b8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0;
  string local_388 [88];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_330;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_320;
  long *local_318;
  long local_310;
  long local_308 [2];
  undefined1 local_2f8 [112];
  bool local_288;
  ios_base local_278 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_270;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_260;
  typed_option<float> local_170;
  typed_option<float> local_d0;
  
  bVar15 = 0;
  local_50c = 0;
  local_518 = all;
  __s = calloc_or_throw<cbify>(1);
  local_508 = __s;
  memset(__s,0,0xd0);
  local_2f8._0_8_ = (_func_int **)0x26;
  local_4f8 = local_4e8;
  local_4f8 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_4f8,(ulong)local_2f8);
  local_4e8[0] = (_func_int **)local_2f8._0_8_;
  local_4f8[2] = (_func_int **)0x6e6f43206f746e69;
  local_4f8[3] = (_func_int **)0x206c617574786574;
  *local_4f8 = (_func_int **)0x6c754d20656b614d;
  local_4f8[1] = (_func_int **)0x207373616c636974;
  builtin_strncpy((char *)((long)local_4f8 + 0x1e),"l Bandit",8);
  local_4f0 = (_func_int **)local_2f8._0_8_;
  *(char *)((long)local_4f8 + local_2f8._0_8_) = '\0';
  local_3f0.m_name._M_dataplus._M_p = (pointer)&local_3f0.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3f0,local_4f8,(char *)(local_2f8._0_8_ + (long)local_4f8));
  local_3f0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3f0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3f0.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_4f8 != local_4e8) {
    operator_delete(local_4f8);
  }
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  local_410.field_2._M_allocated_capacity._0_4_ = 0x66696263;
  local_410.field_2._M_allocated_capacity._4_2_ = 0x79;
  local_410._M_string_length = 5;
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_2f8,&local_410,&local_50c);
  local_288 = true;
  local_490 = local_480;
  local_3b8._0_8_ = (_func_int **)0x42;
  ppp_Var6 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_490,(ulong)local_3b8);
  uVar3 = local_3b8._0_8_;
  local_480[0] = (_func_int **)local_3b8._0_8_;
  local_490 = ppp_Var6;
  memcpy(ppp_Var6,"Convert multiclass on <k> classes into a contextual bandit problem",0x42);
  local_488 = (_func_int **)uVar3;
  *(char *)((long)ppp_Var6 + uVar3) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_2f8 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
                     (&local_3f0,(typed_option<unsigned_int> *)local_2f8);
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  local_430.field_2._M_allocated_capacity = 0x73635f7966696263;
  local_430._M_string_length = 8;
  local_430.field_2._M_local_buf[8] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_3b8,&local_430,&local_519);
  local_4b0 = local_4a0;
  local_170.super_base_option._vptr_base_option = (_func_int **)0x44;
  ppp_Var6 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_4b0,(ulong)&local_170);
  pp_Var1 = local_170.super_base_option._vptr_base_option;
  local_4a0[0] = local_170.super_base_option._vptr_base_option;
  local_4b0 = ppp_Var6;
  memcpy(ppp_Var6,"consume cost-sensitive classification examples instead of multiclass",0x44);
  local_4a8 = pp_Var1;
  *(undefined1 *)((long)ppp_Var6 + (long)pp_Var1) = 0;
  std::__cxx11::string::_M_assign(local_388);
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar7,(typed_option<bool> *)local_3b8);
  local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
  local_450.field_2._M_allocated_capacity._0_4_ = 0x73736f6c;
  local_450.field_2._M_allocated_capacity._4_2_ = 0x30;
  local_450._M_string_length = 5;
  local_500 = &__s->loss0;
  VW::config::typed_option<float>::typed_option(&local_170,&local_450,local_500);
  ptVar8 = VW::config::typed_option<float>::default_value(&local_170,0.0);
  local_4d0 = local_4c0;
  local_d0.super_base_option._vptr_base_option = (_func_int **)0x16;
  local_4d0 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_4d0,(ulong)&local_d0);
  local_4c0[0] = local_d0.super_base_option._vptr_base_option;
  *local_4d0 = (_func_int **)0x726f662073736f6c;
  local_4d0[1] = (_func_int **)0x74636572726f6320;
  builtin_strncpy((char *)((long)local_4d0 + 0xe),"ct label",8);
  local_4c8 = local_d0.super_base_option._vptr_base_option;
  *(char *)((long)local_4d0 + (long)local_d0.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar8->super_base_option).m_help);
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar7,ptVar8)
  ;
  local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
  local_470.field_2._M_allocated_capacity._0_4_ = 0x73736f6c;
  local_470.field_2._M_allocated_capacity._4_2_ = 0x31;
  local_470._M_string_length = 5;
  VW::config::typed_option<float>::typed_option(&local_d0,&local_470,&__s->loss1);
  ptVar8 = VW::config::typed_option<float>::default_value(&local_d0,1.0);
  local_4d8 = 0x18;
  local_318 = local_308;
  local_318 = (long *)std::__cxx11::string::_M_create((ulong *)&local_318,(ulong)&local_4d8);
  local_308[0] = local_4d8;
  *local_318 = 0x726f662073736f6c;
  local_318[1] = 0x6572726f636e6920;
  local_318[2] = 0x6c6562616c207463;
  local_310 = local_4d8;
  *(char *)((long)local_318 + local_4d8) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar8->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar7,ptVar8);
  data = local_508;
  if (local_318 != local_308) {
    operator_delete(local_318);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002dc0d0;
  if (local_d0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p);
  }
  if (local_4d0 != local_4c0) {
    operator_delete(local_4d0);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002dc0d0;
  if (local_170.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p);
  }
  if (local_4b0 != local_4a0) {
    operator_delete(local_4b0);
  }
  local_3b8._0_8_ = &PTR__typed_option_002dc108;
  if (local_320._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_320._M_pi);
  }
  if (local_330._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_330._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_3b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p);
  }
  if (local_490 != local_480) {
    operator_delete(local_490);
  }
  local_2f8._0_8_ = &PTR__typed_option_002dc178;
  if (local_260._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_260._M_pi);
  }
  if (local_270._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_270._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_3f0);
  pp_Var1 = (_func_int **)(local_2f8 + 0x10);
  local_2f8._16_4_ = 0x66696263;
  local_2f8._20_2_ = 0x79;
  local_2f8._8_8_ = (pointer)0x5;
  local_2f8._0_8_ = pp_Var1;
  iVar5 = (*options->_vptr_options_i[1])(options,local_2f8);
  if ((_func_int **)local_2f8._0_8_ != pp_Var1) {
    operator_delete((void *)local_2f8._0_8_);
  }
  if ((char)iVar5 == '\0') {
    plVar10 = (learner<cbify,_example> *)0x0;
    goto LAB_001e721b;
  }
  local_2f8._16_4_ = 0x655f6263;
  local_2f8._20_2_ = 0x7078;
  local_2f8[0x16] = 0x6c;
  local_2f8[0x17] = 0x6f;
  local_2f8[0x18] = 'r';
  local_2f8[0x19] = 'e';
  local_2f8[0x1a] = '_';
  local_2f8[0x1b] = 'a';
  local_2f8._28_2_ = 0x6664;
  local_2f8._8_8_ = (pointer)0xe;
  local_2f8[0x1e] = '\0';
  local_2f8._0_8_ = pp_Var1;
  iVar5 = (*options->_vptr_options_i[1])(options);
  bVar4 = (byte)iVar5;
  data->use_adf = (bool)bVar4;
  if ((_func_int **)local_2f8._0_8_ == pp_Var1) {
    data->app_seed = 0x337ad8c;
    (data->a_s)._begin = (action_score *)0x0;
    (data->a_s)._end = (action_score *)0x0;
    (data->a_s).end_array = (action_score *)0x0;
    (data->a_s).erase_count = 0;
    data->all = local_518;
  }
  else {
    operator_delete((void *)local_2f8._0_8_);
    bVar4 = data->use_adf & 1;
    data->app_seed = 0x337ad8c;
    (data->a_s)._begin = (action_score *)0x0;
    (data->a_s)._end = (action_score *)0x0;
    (data->a_s).end_array = (action_score *)0x0;
    (data->a_s).erase_count = 0;
    data->all = local_518;
  }
  if (bVar4 != 0) {
    init_adf_data(data,(ulong)local_50c);
  }
  local_2f8._16_4_ = 0x655f6263;
  local_2f8._20_2_ = 0x7078;
  local_2f8[0x16] = 0x6c;
  local_2f8[0x17] = 0x6f;
  local_2f8[0x18] = 'r';
  local_2f8[0x19] = 'e';
  local_2f8._8_8_ = (pointer)0xa;
  local_2f8[0x1a] = '\0';
  local_2f8._0_8_ = pp_Var1;
  iVar5 = (*options->_vptr_options_i[1])(options);
  if ((char)iVar5 == '\0') {
    bVar2 = data->use_adf;
    if ((_func_int **)local_2f8._0_8_ != pp_Var1) {
      operator_delete((void *)local_2f8._0_8_);
    }
    if (bVar2 == false) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_2f8);
      std::ostream::_M_insert<unsigned_long>((ulong)(local_2f8 + 0x10));
      local_3b8._16_5_ = 0x78655f6263;
      local_3b8._21_3_ = 0x6f6c70;
      local_3a0._M_allocated_capacity._0_2_ = 0x6572;
      local_3b8._8_8_ = (pointer)0xa;
      local_3a0._M_local_buf[2] = '\0';
      local_3b8._0_8_ = local_3b8 + 0x10;
      std::__cxx11::stringbuf::str();
      (*options->_vptr_options_i[5])(options,local_3b8,&local_170);
      if (local_170.super_base_option._vptr_base_option !=
          (_func_int **)&local_170.super_base_option.m_name._M_string_length) {
        operator_delete(local_170.super_base_option._vptr_base_option);
      }
      if ((undefined1 *)local_3b8._0_8_ != local_3b8 + 0x10) {
        operator_delete((void *)local_3b8._0_8_);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_2f8);
      std::ios_base::~ios_base(local_278);
      data = local_508;
    }
  }
  else if ((_func_int **)local_2f8._0_8_ != pp_Var1) {
    operator_delete((void *)local_2f8._0_8_);
  }
  if (data->use_adf == true) {
    local_2f8._16_4_ = 0x6d5f6263;
    local_2f8._20_2_ = 0x6e69;
    local_2f8[0x16] = 0x5f;
    local_2f8[0x17] = 99;
    local_2f8[0x18] = 'o';
    local_2f8[0x19] = 's';
    local_2f8[0x1a] = 't';
    local_2f8._8_8_ = (pointer)0xb;
    local_2f8[0x1b] = '\0';
    local_2f8._0_8_ = pp_Var1;
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b8,
               vsnprintf,0x3a,"%f",(double)*local_500);
    (*options->_vptr_options_i[5])(options,local_2f8,local_3b8);
    if ((undefined1 *)local_3b8._0_8_ != local_3b8 + 0x10) {
      operator_delete((void *)local_3b8._0_8_);
    }
    if ((_func_int **)local_2f8._0_8_ != pp_Var1) {
      operator_delete((void *)local_2f8._0_8_);
    }
    local_2f8._16_4_ = 0x6d5f6263;
    local_2f8._20_2_ = 0x7861;
    local_2f8[0x16] = 0x5f;
    local_2f8[0x17] = 99;
    local_2f8[0x18] = 'o';
    local_2f8[0x19] = 's';
    local_2f8[0x1a] = 't';
    local_2f8._8_8_ = (pointer)0xb;
    local_2f8[0x1b] = '\0';
    local_2f8._0_8_ = pp_Var1;
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b8,
               vsnprintf,0x3a,"%f",(double)__s->loss1);
    (*options->_vptr_options_i[5])(options,local_2f8,local_3b8);
    if ((undefined1 *)local_3b8._0_8_ != local_3b8 + 0x10) {
      operator_delete((void *)local_3b8._0_8_);
    }
    data = local_508;
    if ((_func_int **)local_2f8._0_8_ != pp_Var1) {
      operator_delete((void *)local_2f8._0_8_);
    }
  }
  local_2f8._16_4_ = 0x65736162;
  local_2f8._20_2_ = 0x696c;
  local_2f8[0x16] = 0x6e;
  local_2f8[0x17] = 0x65;
  local_2f8._8_8_ = (pointer)0x8;
  local_2f8[0x18] = '\0';
  local_2f8._0_8_ = pp_Var1;
  iVar5 = (*options->_vptr_options_i[1])(options);
  if ((_func_int **)local_2f8._0_8_ != pp_Var1) {
    operator_delete((void *)local_2f8._0_8_);
  }
  if ((char)iVar5 != '\0') {
    std::__cxx11::stringstream::stringstream((stringstream *)local_2f8);
    fVar16 = ABS(*local_500);
    fVar17 = ABS(local_500[1]);
    if (fVar17 <= fVar16) {
      fVar17 = fVar16;
    }
    std::ostream::_M_insert<double>((double)(fVar17 / (local_500[1] - *local_500)));
    local_3b8._16_5_ = 0x756d5f726c;
    local_3b8._21_3_ = 0x69746c;
    local_3a0._M_allocated_capacity._0_2_ = 0x6c70;
    local_3a0._M_local_buf[2] = 'i';
    local_3a0._M_allocated_capacity._3_2_ = 0x7265;
    local_3b8._8_8_ = (pointer)0xd;
    local_3a0._M_local_buf[5] = '\0';
    local_3b8._0_8_ = local_3b8 + 0x10;
    std::__cxx11::stringbuf::str();
    (*options->_vptr_options_i[5])(options,local_3b8,&local_170);
    if (local_170.super_base_option._vptr_base_option !=
        (_func_int **)&local_170.super_base_option.m_name._M_string_length) {
      operator_delete(local_170.super_base_option._vptr_base_option);
    }
    if ((undefined1 *)local_3b8._0_8_ != local_3b8 + 0x10) {
      operator_delete((void *)local_3b8._0_8_);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_2f8);
    std::ios_base::~ios_base(local_278);
  }
  if (data->use_adf == true) {
    pbVar9 = setup_base(options,local_518);
    base = LEARNER::as_multiline<char,char>(pbVar9);
    ppVar14 = local_518->p;
    if (local_519 == true) {
      plVar10 = LEARNER::learner<cbify,example>::
                init_learner<LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                          (data,base,predict_or_learn_adf<true,true>,
                           predict_or_learn_adf<false,true>,1,multiclass);
      goto LAB_001e714c;
    }
    plVar10 = LEARNER::learner<cbify,example>::
              init_learner<LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                        (data,base,predict_or_learn_adf<true,false>,
                         predict_or_learn_adf<false,false>,1,multiclass);
LAB_001e71be:
    *(undefined8 *)(plVar10 + 0x58) = *(undefined8 *)(plVar10 + 0x18);
    *(code **)(plVar10 + 0x68) = MULTICLASS::finish_example<cbify>;
    ppuVar12 = &MULTICLASS::mc_label;
  }
  else {
    pbVar9 = setup_base(options,local_518);
    base_00 = LEARNER::as_singleline<char,char>(pbVar9);
    ppVar14 = local_518->p;
    if (local_519 != true) {
      plVar10 = LEARNER::learner<cbify,example>::init_learner<LEARNER::learner<char,example>>
                          (data,base_00,predict_or_learn<true,false>,predict_or_learn<false,false>,1
                           ,multiclass);
      goto LAB_001e71be;
    }
    plVar10 = LEARNER::learner<cbify,example>::init_learner<LEARNER::learner<char,example>>
                        (data,base_00,predict_or_learn<true,true>,predict_or_learn<false,true>,1,
                         multiclass);
LAB_001e714c:
    *(undefined8 *)(plVar10 + 0x58) = *(undefined8 *)(plVar10 + 0x18);
    *(code **)(plVar10 + 0x68) = COST_SENSITIVE::finish_example<cbify>;
    ppuVar12 = &COST_SENSITIVE::cs_label;
  }
  plVar13 = &ppVar14->lp;
  for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
    plVar13->default_label = (_func_void_void_ptr *)*ppuVar12;
    ppuVar12 = ppuVar12 + (ulong)bVar15 * -2 + 1;
    plVar13 = (label_parser *)((long)plVar13 + (ulong)bVar15 * -0x10 + 8);
  }
  *(undefined8 *)(plVar10 + 0xb8) = *(undefined8 *)(plVar10 + 0x18);
  *(undefined8 *)(plVar10 + 0xc0) = *(undefined8 *)(plVar10 + 0x20);
  *(code **)(plVar10 + 200) = finish;
  local_518->delete_prediction = (_func_void_void_ptr *)0x0;
  data = (cbify *)0x0;
LAB_001e721b:
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_3f0.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0.m_name._M_dataplus._M_p != &local_3f0.m_name.field_2) {
    operator_delete(local_3f0.m_name._M_dataplus._M_p);
  }
  if (data != (cbify *)0x0) {
    destroy_free<cbify>(data);
  }
  return (base_learner *)plVar10;
}

Assistant:

base_learner* cbify_setup(options_i& options, vw& all)
{
  uint32_t num_actions = 0;
  auto data = scoped_calloc_or_throw<cbify>();
  bool use_cs;

  option_group_definition new_options("Make Multiclass into Contextual Bandit");
  new_options
      .add(make_option("cbify", num_actions)
               .keep()
               .help("Convert multiclass on <k> classes into a contextual bandit problem"))
      .add(make_option("cbify_cs", use_cs).help("consume cost-sensitive classification examples instead of multiclass"))
      .add(make_option("loss0", data->loss0).default_value(0.f).help("loss for correct label"))
      .add(make_option("loss1", data->loss1).default_value(1.f).help("loss for incorrect label"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("cbify"))
    return nullptr;

  data->use_adf = options.was_supplied("cb_explore_adf");
  data->app_seed = uniform_hash("vw", 2, 0);
  data->a_s = v_init<action_score>();
  data->all = &all;

  if (data->use_adf)
    init_adf_data(*data.get(), num_actions);

  if (!options.was_supplied("cb_explore") && !data->use_adf)
  {
    stringstream ss;
    ss << num_actions;
    options.insert("cb_explore", ss.str());
  }

  if (data->use_adf)
  {
    options.insert("cb_min_cost", to_string(data->loss0));
    options.insert("cb_max_cost", to_string(data->loss1));
  }

  if (options.was_supplied("baseline"))
  {
    stringstream ss;
    ss << max<float>(abs(data->loss0), abs(data->loss1)) / (data->loss1 - data->loss0);
    options.insert("lr_multiplier", ss.str());
  }

  learner<cbify, example>* l;

  if (data->use_adf)
  {
    multi_learner* base = as_multiline(setup_base(options, all));
    if (use_cs)
      l = &init_cost_sensitive_learner(
          data, base, predict_or_learn_adf<true, true>, predict_or_learn_adf<false, true>, all.p, 1);
    else
      l = &init_multiclass_learner(
          data, base, predict_or_learn_adf<true, false>, predict_or_learn_adf<false, false>, all.p, 1);
  }
  else
  {
    single_learner* base = as_singleline(setup_base(options, all));
    if (use_cs)
      l = &init_cost_sensitive_learner(
          data, base, predict_or_learn<true, true>, predict_or_learn<false, true>, all.p, 1);
    else
      l = &init_multiclass_learner(data, base, predict_or_learn<true, false>, predict_or_learn<false, false>, all.p, 1);
  }
  l->set_finish(finish);
  all.delete_prediction = nullptr;

  return make_base(*l);
}